

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O1

int secp256k1_scalar_add(secp256k1_scalar *r,secp256k1_scalar *a,secp256k1_scalar *b)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  bool bVar12;
  
  uVar1 = b->d[0];
  uVar9 = a->d[0];
  uVar2 = uVar1 + a->d[0];
  r->d[0] = uVar2;
  uVar1 = (ulong)CARRY8(uVar1,uVar9);
  uVar9 = a->d[1] + uVar1;
  uVar3 = (ulong)CARRY8(a->d[1],uVar1);
  uVar1 = b->d[1];
  uVar10 = uVar9 + b->d[1];
  r->d[1] = uVar10;
  uVar1 = (ulong)CARRY8(uVar9,uVar1);
  uVar9 = uVar3 + a->d[2];
  uVar4 = uVar9 + uVar1;
  uVar8 = (ulong)(CARRY8(uVar3,a->d[2]) || CARRY8(uVar9,uVar1));
  uVar1 = b->d[2];
  uVar5 = uVar4 + b->d[2];
  r->d[2] = uVar5;
  uVar9 = (ulong)CARRY8(uVar4,uVar1);
  uVar3 = uVar8 + a->d[3];
  uVar4 = uVar3 + uVar9;
  uVar1 = b->d[3];
  bVar12 = uVar4 + uVar1 == -1;
  bVar6 = (0xbaaedce6af48a03a < uVar10 && 0xfffffffffffffffd < uVar5) && bVar12;
  uVar7 = 0;
  if (0xbaaedce6af48a03b < uVar10) {
    uVar7 = (uint)bVar6;
  }
  uVar11 = 0;
  if (0xbfd25e8cd0364140 < uVar2) {
    uVar11 = (uint)bVar6;
  }
  uVar8 = (ulong)((uint)(CARRY8(uVar8,a->d[3]) || CARRY8(uVar3,uVar9)) +
                  (uVar11 | uVar7 | (uVar5 == 0xffffffffffffffff && bVar12)) +
                 (uint)CARRY8(uVar4,uVar1));
  uVar9 = (ulong)CARRY8(uVar8 * 0x402da1732fc9bebf,uVar2);
  uVar3 = uVar8 * 0x4551231950b75fc4 + uVar10;
  r->d[0] = uVar8 * 0x402da1732fc9bebf + uVar2;
  r->d[1] = uVar3 + uVar9;
  uVar9 = (ulong)(CARRY8(uVar8 * 0x4551231950b75fc4,uVar10) || CARRY8(uVar3,uVar9));
  r->d[2] = uVar5 + uVar8 + uVar9;
  r->d[3] = uVar4 + uVar1 + (ulong)(CARRY8(uVar5,uVar8) || CARRY8(uVar5 + uVar8,uVar9));
  return (int)uVar2;
}

Assistant:

static int secp256k1_scalar_add(secp256k1_scalar *r, const secp256k1_scalar *a, const secp256k1_scalar *b) {
    int overflow;
    secp256k1_uint128 t;
    SECP256K1_SCALAR_VERIFY(a);
    SECP256K1_SCALAR_VERIFY(b);

    secp256k1_u128_from_u64(&t, a->d[0]);
    secp256k1_u128_accum_u64(&t, b->d[0]);
    r->d[0] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, a->d[1]);
    secp256k1_u128_accum_u64(&t, b->d[1]);
    r->d[1] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, a->d[2]);
    secp256k1_u128_accum_u64(&t, b->d[2]);
    r->d[2] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, a->d[3]);
    secp256k1_u128_accum_u64(&t, b->d[3]);
    r->d[3] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    overflow = secp256k1_u128_to_u64(&t) + secp256k1_scalar_check_overflow(r);
    VERIFY_CHECK(overflow == 0 || overflow == 1);
    secp256k1_scalar_reduce(r, overflow);

    SECP256K1_SCALAR_VERIFY(r);
    return overflow;
}